

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O0

bool P_GiveBody(AActor *actor,int num,int max)

{
  player_t *ppVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  player_t *player;
  int max_local;
  int num_local;
  AActor *actor_local;
  
  if ((0 < actor->health) &&
     ((actor->player == (player_t *)0x0 || (actor->player->playerstate != '\x01')))) {
    ppVar1 = actor->player;
    iVar2 = clamp<int>(num,-0x10000,0x10000);
    if (ppVar1 == (player_t *)0x0) {
      iVar3 = AActor::SpawnHealth(actor);
      if (iVar2 < 0) {
        iVar2 = (iVar3 * -iVar2) / 100;
        if (actor->health < iVar2) {
          actor->health = iVar2;
          return true;
        }
      }
      else if (actor->health < iVar3) {
        actor->health = iVar2 + actor->health;
        if (iVar3 < actor->health) {
          actor->health = iVar3;
        }
        return true;
      }
    }
    else {
      player._0_4_ = max;
      if (max < 1) {
        iVar3 = APlayerPawn::GetMaxHealth((APlayerPawn *)actor);
        player._0_4_ = iVar3 + (ppVar1->mo->super_AActor).stamina;
        if (ppVar1->morphTics != 0) {
          if ((ppVar1->MorphStyle & 2U) == 0) {
            player._0_4_ = 0x1e;
            if ((ppVar1->MorphStyle & 1U) != 0) {
              player._0_4_ = (ppVar1->mo->super_AActor).stamina + 0x1e;
            }
          }
          else if ((ppVar1->MorphStyle & 1U) == 0) {
            player._0_4_ = (int)player - (ppVar1->mo->super_AActor).stamina;
          }
        }
      }
      if (iVar2 < 0) {
        iVar2 = ((int)player * -iVar2) / 100;
        if (ppVar1->health < iVar2) {
          ppVar1->health = iVar2;
          actor->health = iVar2;
          return true;
        }
      }
      else if ((0 < iVar2) && (ppVar1->health < (int)player)) {
        dVar4 = G_SkillProperty(SKILLP_HealthFactor);
        player._4_4_ = (int)((double)iVar2 * dVar4);
        if (player._4_4_ < 1) {
          player._4_4_ = 1;
        }
        ppVar1->health = player._4_4_ + ppVar1->health;
        if ((int)player < ppVar1->health) {
          ppVar1->health = (int)player;
        }
        actor->health = ppVar1->health;
        return true;
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool P_GiveBody (AActor *actor, int num, int max)
{
	if (actor->health <= 0 || (actor->player != NULL && actor->player->playerstate == PST_DEAD))
	{ // Do not heal dead things.
		return false;
	}

	player_t *player = actor->player;

	num = clamp(num, -65536, 65536);	// prevent overflows for bad values
	if (player != NULL)
	{
		// Max is 0 by default, preserving default behavior for P_GiveBody()
		// calls while supporting AHealth.
		if (max <= 0)
		{
			max = static_cast<APlayerPawn*>(actor)->GetMaxHealth() + player->mo->stamina;
			// [MH] First step in predictable generic morph effects
 			if (player->morphTics)
 			{
				if (player->MorphStyle & MORPH_FULLHEALTH)
				{
					if (!(player->MorphStyle & MORPH_ADDSTAMINA))
					{
						max -= player->mo->stamina;
					}
				}
				else // old health behaviour
				{
					max = MAXMORPHHEALTH;
					if (player->MorphStyle & MORPH_ADDSTAMINA)
					{
						max += player->mo->stamina;
					}
				}
 			}
		}
		// [RH] For Strife: A negative body sets you up with a percentage
		// of your full health.
		if (num < 0)
		{
			num = max * -num / 100;
			if (player->health < num)
			{
				player->health = num;
				actor->health = num;
				return true;
			}
		}
		else if (num > 0)
		{
			if (player->health < max)
			{
				num = int(num * G_SkillProperty(SKILLP_HealthFactor));
				if (num < 1) num = 1;
				player->health += num;
				if (player->health > max)
				{
					player->health = max;
				}
				actor->health = player->health;
				return true;
			}
		}
	}
	else
	{
		// Parameter value for max is ignored on monsters, preserving original
		// behaviour on AHealth as well as on existing calls to P_GiveBody().
		max = actor->SpawnHealth();
		if (num < 0)
		{
			num = max * -num / 100;
			if (actor->health < num)
			{
				actor->health = num;
				return true;
			}
		}
		else if (actor->health < max)
		{
			actor->health += num;
			if (actor->health > max)
			{
				actor->health = max;
			}
			return true;
		}
	}
	return false;
}